

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O1

void __thiscall
FIX::double_conversion::RoundUp
          (double_conversion *this,Vector<char> buffer,int *length,int *decimal_point)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  uint *puVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  
  puVar4 = buffer._8_8_;
  uVar1 = *puVar4;
  iVar5 = (int)buffer.start_;
  if ((ulong)uVar1 == 0) {
    if (0 < iVar5) {
      *this = (double_conversion)0x31;
      *length = 1;
      *puVar4 = 1;
      return;
    }
  }
  else if ((0 < (int)uVar1) && ((int)uVar1 <= iVar5)) {
    this[(ulong)uVar1 - 1] = (double_conversion)((char)this[(ulong)uVar1 - 1] + '\x01');
    uVar1 = *puVar4;
    lVar3 = (long)(int)uVar1;
    bVar8 = lVar3 < 2;
    if (1 < lVar3) {
      lVar6 = lVar3 + 1;
      do {
        if (iVar5 < (int)uVar1) goto LAB_00170410;
        if (this[lVar6 + -2] != (double_conversion)0x3a) {
          if (!bVar8) {
            return;
          }
          break;
        }
        this[lVar6 + -2] = (double_conversion)0x30;
        if ((long)iVar5 <= lVar3 + -2) goto LAB_00170410;
        this[lVar6 + -3] = (double_conversion)((char)this[lVar6 + -3] + '\x01');
        lVar7 = lVar6 + -1;
        lVar2 = lVar6 + -4;
        bVar8 = lVar7 < 3;
        lVar6 = lVar7;
      } while (SBORROW8(lVar7,3) == lVar2 < 0);
    }
    if (0 < iVar5) {
      if (*this != (double_conversion)0x3a) {
        return;
      }
      *this = (double_conversion)0x31;
      *length = *length + 1;
      return;
    }
  }
LAB_00170410:
  __assert_fail("0 <= index && index < length_",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                ,0xcc,"T &FIX::double_conversion::Vector<char>::operator[](int) const [T = char]");
}

Assistant:

static void RoundUp(Vector<char> buffer, int* length, int* decimal_point) {
  // An empty buffer represents 0.
  if (*length == 0) {
    buffer[0] = '1';
    *decimal_point = 1;
    *length = 1;
    return;
  }
  // Round the last digit until we either have a digit that was not '9' or until
  // we reached the first digit.
  buffer[(*length) - 1]++;
  for (int i = (*length) - 1; i > 0; --i) {
    if (buffer[i] != '0' + 10) {
      return;
    }
    buffer[i] = '0';
    buffer[i - 1]++;
  }
  // If the first digit is now '0' + 10, we would need to set it to '0' and add
  // a '1' in front. However we reach the first digit only if all following
  // digits had been '9' before rounding up. Now all trailing digits are '0' and
  // we simply switch the first digit to '1' and update the decimal-point
  // (indicating that the point is now one digit to the right).
  if (buffer[0] == '0' + 10) {
    buffer[0] = '1';
    (*decimal_point)++;
  }
}